

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void module_free_common(lys_module *module,_func_void_lys_node_ptr_void_ptr *private_destructor)

{
  ly_ctx *ctx_00;
  lys_node *plVar1;
  uint local_34;
  lys_node *plStack_30;
  uint i;
  lys_node *iter;
  lys_node *next;
  ly_ctx *ctx;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_module *module_local;
  
  if (module->ctx != (ly_ctx *)0x0) {
    ctx_00 = module->ctx;
    for (local_34 = 0; local_34 < module->imp_size; local_34 = local_34 + 1) {
      lydict_remove(ctx_00,module->imp[local_34].prefix);
      lydict_remove(ctx_00,module->imp[local_34].dsc);
      lydict_remove(ctx_00,module->imp[local_34].ref);
      lys_extension_instances_free
                (ctx_00,module->imp[local_34].ext,(uint)module->imp[local_34].ext_size);
    }
    free(module->imp);
    if ((module->field_0x40 & 1) == 0) {
      plStack_30 = module->data;
      while (plStack_30 != (lys_node *)0x0) {
        plVar1 = plStack_30->next;
        lys_node_free(plStack_30,private_destructor,0);
        plStack_30 = plVar1;
      }
    }
    lydict_remove(ctx_00,module->dsc);
    lydict_remove(ctx_00,module->ref);
    lydict_remove(ctx_00,module->org);
    lydict_remove(ctx_00,module->contact);
    lydict_remove(ctx_00,module->filepath);
    for (local_34 = 0; local_34 < module->rev_size; local_34 = local_34 + 1) {
      lys_extension_instances_free
                (ctx_00,module->rev[local_34].ext,(uint)module->rev[local_34].ext_size);
      lydict_remove(ctx_00,module->rev[local_34].dsc);
      lydict_remove(ctx_00,module->rev[local_34].ref);
    }
    free(module->rev);
    for (local_34 = 0; local_34 < module->ident_size; local_34 = local_34 + 1) {
      lys_ident_free(ctx_00,module->ident + local_34);
    }
    module->ident_size = 0;
    free(module->ident);
    for (local_34 = 0; local_34 < module->tpdf_size; local_34 = local_34 + 1) {
      lys_tpdf_free(ctx_00,module->tpdf + local_34);
    }
    free(module->tpdf);
    lys_extension_instances_free(ctx_00,module->ext,(uint)module->ext_size);
    for (local_34 = 0; local_34 < module->inc_size; local_34 = local_34 + 1) {
      lydict_remove(ctx_00,module->inc[local_34].dsc);
      lydict_remove(ctx_00,module->inc[local_34].ref);
      lys_extension_instances_free
                (ctx_00,module->inc[local_34].ext,(uint)module->inc[local_34].ext_size);
      if ((module->field_0x40 & 1) == 0) {
        lys_submodule_free(module->inc[local_34].submodule,private_destructor);
      }
    }
    free(module->inc);
    for (local_34 = 0; local_34 < module->augment_size; local_34 = local_34 + 1) {
      lys_augment_free(ctx_00,module->augment + local_34,private_destructor);
    }
    free(module->augment);
    for (local_34 = 0; local_34 < module->features_size; local_34 = local_34 + 1) {
      lys_feature_free(ctx_00,module->features + local_34);
    }
    free(module->features);
    for (local_34 = 0; local_34 < module->deviation_size; local_34 = local_34 + 1) {
      lys_deviation_free(module,module->deviation + local_34);
    }
    free(module->deviation);
    for (local_34 = 0; local_34 < module->extensions_size; local_34 = local_34 + 1) {
      lys_extension_free(ctx_00,module->extensions + local_34);
    }
    free(module->extensions);
    lydict_remove(ctx_00,module->name);
    lydict_remove(ctx_00,module->prefix);
    return;
  }
  __assert_fail("module->ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                ,0xa16,
                "void module_free_common(struct lys_module *, void (*)(const struct lys_node *, void *))"
               );
}

Assistant:

static void
module_free_common(struct lys_module *module, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    struct ly_ctx *ctx;
    struct lys_node *next, *iter;
    unsigned int i;

    assert(module->ctx);
    ctx = module->ctx;

    /* just free the import array, imported modules will stay in the context */
    for (i = 0; i < module->imp_size; i++) {
        lydict_remove(ctx, module->imp[i].prefix);
        lydict_remove(ctx, module->imp[i].dsc);
        lydict_remove(ctx, module->imp[i].ref);
        lys_extension_instances_free(ctx, module->imp[i].ext, module->imp[i].ext_size);
    }
    free(module->imp);

    /* submodules don't have data tree, the data nodes
     * are placed in the main module altogether */
    if (!module->type) {
        LY_TREE_FOR_SAFE(module->data, next, iter) {
            lys_node_free(iter, private_destructor, 0);
        }
    }

    lydict_remove(ctx, module->dsc);
    lydict_remove(ctx, module->ref);
    lydict_remove(ctx, module->org);
    lydict_remove(ctx, module->contact);
    lydict_remove(ctx, module->filepath);

    /* revisions */
    for (i = 0; i < module->rev_size; i++) {
        lys_extension_instances_free(ctx, module->rev[i].ext, module->rev[i].ext_size);
        lydict_remove(ctx, module->rev[i].dsc);
        lydict_remove(ctx, module->rev[i].ref);
    }
    free(module->rev);

    /* identities */
    for (i = 0; i < module->ident_size; i++) {
        lys_ident_free(ctx, &module->ident[i]);
    }
    module->ident_size = 0;
    free(module->ident);

    /* typedefs */
    for (i = 0; i < module->tpdf_size; i++) {
        lys_tpdf_free(ctx, &module->tpdf[i]);
    }
    free(module->tpdf);

    /* extension instances */
    lys_extension_instances_free(ctx, module->ext, module->ext_size);

    /* include */
    for (i = 0; i < module->inc_size; i++) {
        lydict_remove(ctx, module->inc[i].dsc);
        lydict_remove(ctx, module->inc[i].ref);
        lys_extension_instances_free(ctx, module->inc[i].ext, module->inc[i].ext_size);
        /* complete submodule free is done only from main module since
         * submodules propagate their includes to the main module */
        if (!module->type) {
            lys_submodule_free(module->inc[i].submodule, private_destructor);
        }
    }
    free(module->inc);

    /* augment */
    for (i = 0; i < module->augment_size; i++) {
        lys_augment_free(ctx, &module->augment[i], private_destructor);
    }
    free(module->augment);

    /* features */
    for (i = 0; i < module->features_size; i++) {
        lys_feature_free(ctx, &module->features[i]);
    }
    free(module->features);

    /* deviations */
    for (i = 0; i < module->deviation_size; i++) {
        lys_deviation_free(module, &module->deviation[i]);
    }
    free(module->deviation);

    /* extensions */
    for (i = 0; i < module->extensions_size; i++) {
        lys_extension_free(ctx, &module->extensions[i]);
    }
    free(module->extensions);

    lydict_remove(ctx, module->name);
    lydict_remove(ctx, module->prefix);
}